

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswCore.c
# Opt level: O1

Aig_Man_t * Ssw_SignalCorrespondenceRefine(Ssw_Man_t *p)

{
  int *piVar1;
  code *pcVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  Ssw_Sat_t *pSVar7;
  Ssw_Pars_t *pSVar8;
  Aig_Man_t *pAVar9;
  char *pcVar10;
  Aig_Obj_t *pAVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  Ssw_Cla_t *pSVar16;
  Ssw_Man_t *pSVar17;
  int iVar18;
  long lVar19;
  int iVar20;
  int local_54;
  timespec ts;
  int local_3c;
  
  iVar3 = clock_gettime(3,(timespec *)&ts);
  if (iVar3 < 0) {
    lVar12 = 1;
  }
  else {
    lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
    lVar12 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + ts.tv_sec * -1000000;
  }
  pSVar16 = p->ppClasses;
  iVar4 = Ssw_ClassesLitNum(pSVar16);
  iVar3 = (int)pSVar16;
  p->nLitsBeg = iVar4;
  pAVar9 = p->pAig;
  p->nNodesBeg = pAVar9->nObjs[6] + pAVar9->nObjs[5];
  p->nRegsBeg = pAVar9->nRegs;
  if (p->pPars->fVerbose != 0) {
    Abc_Print(iVar3,"Before BMC: ");
    pSVar16 = p->ppClasses;
    Ssw_ClassesPrint(pSVar16,0);
    iVar3 = (int)pSVar16;
  }
  if (p->pPars->fLatchCorr == 0) {
    pSVar7 = Ssw_SatStart(0);
    p->pMSat = pSVar7;
    if (p->pPars->fConstrs == 0) {
      Ssw_ManSweepBmc(p);
    }
    else {
      Ssw_ManSweepBmcConstr(p);
    }
    Ssw_SatStop(p->pMSat);
    p->pMSat = (Ssw_Sat_t *)0x0;
    pSVar17 = p;
    Ssw_ManCleanup(p);
    iVar3 = (int)pSVar17;
  }
  if (p->pPars->fVerbose != 0) {
    Abc_Print(iVar3,"After  BMC: ");
    pSVar16 = p->ppClasses;
    Ssw_ClassesPrint(pSVar16,0);
    iVar3 = (int)pSVar16;
  }
  pcVar2 = (code *)p->pPars->pFunc;
  if (pcVar2 != (code *)0x0) {
    (*pcVar2)(p->pPars->pData);
    iVar3 = (int)p->pPars->pData;
    (*(code *)p->pPars->pFunc)();
  }
  if (p->pPars->nStepsMax == 0) {
    Abc_Print(iVar3,"Stopped signal correspondence after BMC.\n");
    uVar14 = 0xffffffff;
  }
  else {
    pSVar8 = p->pPars;
    if (pSVar8->nStepsMax == 0) {
      uVar14 = 0;
    }
    else {
      iVar4 = 0;
      iVar20 = 0;
      uVar14 = 0;
      local_54 = 0;
      iVar18 = 0;
      do {
        if (uVar14 == pSVar8->nItersStop && -1 < pSVar8->nItersStop) {
          pAVar9 = Ssw_SpeculativeReduction(p);
          Aig_ManDumpBlif(pAVar9,"srm.blif",(Vec_Ptr_t *)0x0,(Vec_Ptr_t *)0x0);
          Aig_ManStop(pAVar9);
          iVar3 = (int)pAVar9;
          Abc_Print(iVar3,"Iterative refinement is stopped before iteration %d.\n",(ulong)uVar14);
          Abc_Print(iVar3,"The network is reduced using candidate equivalences.\n");
          Abc_Print(iVar3,"Speculatively reduced miter is saved in file \"%s\".\n","srm.blif");
          Abc_Print(iVar3,"If the miter is SAT, the reduced result is incorrect.\n");
          goto LAB_006103b0;
        }
        iVar3 = clock_gettime(3,(timespec *)&ts);
        if (iVar3 < 0) {
          lVar19 = -1;
        }
        else {
          lVar19 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
        }
        pSVar7 = Ssw_SatStart(0);
        p->pMSat = pSVar7;
        pSVar8 = p->pPars;
        if (pSVar8->fLatchCorrOpt == 0) {
          if (pSVar8->fConstrs == 0) {
            if (pSVar8->fDynamic == 0) {
              local_3c = Ssw_ManSweep(p);
            }
            else {
              local_3c = Ssw_ManSweepDyn(p);
            }
          }
          else {
            local_3c = Ssw_ManSweepConstr(p);
          }
          pSVar8 = p->pPars;
          piVar1 = &pSVar8->nConflicts;
          *piVar1 = *piVar1 + (int)(p->pMSat->pSat->stats).conflicts;
          if (pSVar8->fVerbose != 0) {
            uVar5 = Ssw_ClassesCand1Num(p->ppClasses);
            uVar6 = Ssw_ClassesClassNum(p->ppClasses);
            uVar15 = p->pFrames->nObjs[6] + p->pFrames->nObjs[5];
            Abc_Print(uVar15,"%3d : C =%7d. Cl =%7d. LR =%6d. NR =%6d. ",(ulong)uVar14,(ulong)uVar5,
                      (ulong)uVar6,(ulong)(uint)p->nConstrReduced,(ulong)uVar15);
            if (p->pPars->fDynamic != 0) {
              Abc_Print(uVar15,"Cex =%5d. ",(ulong)(uint)(p->nSatCallsSat - iVar20));
              Abc_Print(uVar15,"R =%4d. ",(ulong)(uint)(p->nRecycles - local_54));
            }
            pAVar9 = p->pAig;
            pcVar10 = "-";
            if (pAVar9->nTruePos == 1) {
              if (pAVar9->vCos->nSize < 1) goto LAB_006104f9;
              if (pAVar9->pReprs == (Aig_Obj_t **)0x0) {
                pAVar11 = (Aig_Obj_t *)0x0;
              }
              else {
                pAVar11 = pAVar9->pReprs
                          [*(int *)((*(ulong *)((long)*pAVar9->vCos->pArray + 8) &
                                    0xfffffffffffffffe) + 0x24)];
              }
              pcVar10 = "+";
              if (pAVar11 != pAVar9->pConst1) {
                pcVar10 = "-";
              }
            }
            Abc_Print(uVar15,"F =%5d. %s ",(ulong)(uint)(p->nSatFailsReal - iVar18),pcVar10);
            Abc_Print(uVar15,"%s =","T");
            iVar4 = 3;
            iVar3 = clock_gettime(3,(timespec *)&ts);
            if (iVar3 < 0) {
              lVar13 = -1;
            }
            else {
              lVar13 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
            }
            Abc_Print(iVar4,"%9.2f sec\n",(double)(lVar13 - lVar19) / 1000000.0);
          }
          if ((p->pPars->fStopWhenGone != 0) && (pAVar9 = p->pAig, pAVar9->nTruePos == 1)) {
            if (pAVar9->vCos->nSize < 1) {
LAB_006104f9:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            if (pAVar9->pReprs == (Aig_Obj_t **)0x0) {
              pAVar11 = (Aig_Obj_t *)0x0;
            }
            else {
              pAVar11 = pAVar9->pReprs
                        [*(int *)((*(ulong *)((long)*pAVar9->vCos->pArray + 8) & 0xfffffffffffffffe)
                                 + 0x24)];
            }
            if (pAVar11 != pAVar9->pConst1) {
              printf("Iterative refinement is stopped after iteration %d\n",(ulong)uVar14);
              puts("because the property output is no longer a candidate constant.");
              p->nLitsEnd = p->nLitsBeg;
              p->nNodesEnd = p->nNodesBeg;
              p->nRegsEnd = p->nRegsBeg;
              Ssw_SatStop(p->pMSat);
              p->pMSat = (Ssw_Sat_t *)0x0;
              Ssw_ManCleanup(p);
              Aig_ManSetPhase(p->pAig);
              Aig_ManCleanMarkB(p->pAig);
              pAVar9 = Aig_ManDupSimple(p->pAig);
              return pAVar9;
            }
          }
        }
        else {
          local_3c = Ssw_ManSweepLatch(p);
          if (p->pPars->fVerbose != 0) {
            uVar5 = Ssw_ClassesCand1Num(p->ppClasses);
            uVar6 = Ssw_ClassesClassNum(p->ppClasses);
            uVar15 = p->nRecycles - local_54;
            Abc_Print(uVar15,"%3d : C =%7d. Cl =%7d. Pr =%6d. Cex =%5d. R =%4d. F =%4d. ",
                      (ulong)uVar14,(ulong)uVar5,(ulong)uVar6,(ulong)(uint)(p->nSatProof - iVar4),
                      (ulong)(uint)(p->nSatCallsSat - iVar20),(ulong)uVar15,
                      (ulong)(uint)(p->nSatFailsReal - iVar18));
            Abc_Print(uVar15,"%s =","T");
            iVar4 = 3;
            iVar3 = clock_gettime(3,(timespec *)&ts);
            if (iVar3 < 0) {
              lVar13 = -1;
            }
            else {
              lVar13 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
            }
            Abc_Print(iVar4,"%9.2f sec\n",(double)(lVar13 - lVar19) / 1000000.0);
          }
        }
        iVar4 = p->nSatProof;
        iVar20 = p->nSatCallsSat;
        local_54 = p->nRecycles;
        pSVar7 = p->pMSat;
        iVar3 = pSVar7->nSatVars;
        if (pSVar7->nSatVars < p->nVarsMax) {
          iVar3 = p->nVarsMax;
        }
        iVar18 = p->nSatFailsReal;
        p->nVarsMax = iVar3;
        iVar3 = pSVar7->nSolverCalls;
        if (pSVar7->nSolverCalls < p->nCallsMax) {
          iVar3 = p->nCallsMax;
        }
        p->nCallsMax = iVar3;
        Ssw_SatStop(pSVar7);
        p->pMSat = (Ssw_Sat_t *)0x0;
        pSVar17 = p;
        Ssw_ManCleanup(p);
        iVar3 = (int)pSVar17;
        if (local_3c == 0) goto LAB_006103b0;
        pcVar2 = (code *)p->pPars->pFunc;
        if (pcVar2 != (code *)0x0) {
          iVar3 = (int)p->pPars->pData;
          (*pcVar2)();
        }
        uVar14 = uVar14 + 1;
        pSVar8 = p->pPars;
      } while (uVar14 != pSVar8->nStepsMax);
    }
    Abc_Print(iVar3,"Stopped signal correspondence after %d refiment iterations.\n",(ulong)uVar14);
  }
LAB_006103b0:
  p->pPars->nIters = uVar14 + 1;
  iVar3 = clock_gettime(3,(timespec *)&ts);
  if (iVar3 < 0) {
    lVar19 = -1;
  }
  else {
    lVar19 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
  }
  p->timeTotal = lVar19 + lVar12;
  Ssw_ManUpdateEquivs(p,p->pAig,(int)(lVar19 + lVar12));
  pAVar9 = Aig_ManDupRepr(p->pAig,0);
  Aig_ManSeqCleanup(pAVar9);
  iVar3 = Ssw_ClassesLitNum(p->ppClasses);
  p->nLitsEnd = iVar3;
  p->nNodesEnd = pAVar9->nObjs[6] + pAVar9->nObjs[5];
  p->nRegsEnd = pAVar9->nRegs;
  Aig_ManSetPhase(p->pAig);
  Aig_ManCleanMarkB(p->pAig);
  return pAVar9;
}

Assistant:

Aig_Man_t * Ssw_SignalCorrespondenceRefine( Ssw_Man_t * p )
{
    int nSatProof, nSatCallsSat, nRecycles, nSatFailsReal, nUniques;
    Aig_Man_t * pAigNew;
    int RetValue, nIter = -1;
    abctime clk, clkTotal = Abc_Clock();
    // get the starting stats
    p->nLitsBeg  = Ssw_ClassesLitNum( p->ppClasses );
    p->nNodesBeg = Aig_ManNodeNum(p->pAig);
    p->nRegsBeg  = Aig_ManRegNum(p->pAig);
    // refine classes using BMC
    if ( p->pPars->fVerbose )
    {
        Abc_Print( 1, "Before BMC: " );
        Ssw_ClassesPrint( p->ppClasses, 0 );
    }
    if ( !p->pPars->fLatchCorr )
    {
        p->pMSat = Ssw_SatStart( 0 );
        if ( p->pPars->fConstrs )
            Ssw_ManSweepBmcConstr( p );
        else
            Ssw_ManSweepBmc( p );
        Ssw_SatStop( p->pMSat );
        p->pMSat = NULL;
        Ssw_ManCleanup( p );
    }
    if ( p->pPars->fVerbose )
    {
        Abc_Print( 1, "After  BMC: " );
        Ssw_ClassesPrint( p->ppClasses, 0 );
    }
    // apply semi-formal filtering
/*
    if ( p->pPars->fSemiFormal )
    {
        Aig_Man_t * pSRed;
        Ssw_FilterUsingSemi( p, 0, 2000, p->pPars->fVerbose );
//        Ssw_FilterUsingSemi( p, 1, 100000, p->pPars->fVerbose );
        pSRed = Ssw_SpeculativeReduction( p );
        Aig_ManDumpBlif( pSRed, "srm.blif", NULL, NULL );
        Aig_ManStop( pSRed );
    }
*/
    if ( p->pPars->pFunc )
    {
        ((int (*)(void *))p->pPars->pFunc)( p->pPars->pData );
        ((int (*)(void *))p->pPars->pFunc)( p->pPars->pData );
    }
    if ( p->pPars->nStepsMax == 0 )
    {
        Abc_Print( 1, "Stopped signal correspondence after BMC.\n" );
        goto finalize;
    }
    // refine classes using induction
    nSatProof = nSatCallsSat = nRecycles = nSatFailsReal = nUniques = 0;
    for ( nIter = 0; ; nIter++ )
    {
        if ( p->pPars->nStepsMax == nIter )
        {
            Abc_Print( 1, "Stopped signal correspondence after %d refiment iterations.\n", nIter );
            goto finalize;
        }
        if ( p->pPars->nItersStop >= 0 && p->pPars->nItersStop == nIter )
        {
            Aig_Man_t * pSRed = Ssw_SpeculativeReduction( p );
            Aig_ManDumpBlif( pSRed, "srm.blif", NULL, NULL );
            Aig_ManStop( pSRed );
            Abc_Print( 1, "Iterative refinement is stopped before iteration %d.\n", nIter );
            Abc_Print( 1, "The network is reduced using candidate equivalences.\n" );
            Abc_Print( 1, "Speculatively reduced miter is saved in file \"%s\".\n", "srm.blif" );
            Abc_Print( 1, "If the miter is SAT, the reduced result is incorrect.\n" );
            break;
        }

clk = Abc_Clock();
        p->pMSat = Ssw_SatStart( 0 );
        if ( p->pPars->fLatchCorrOpt )
        {
            RetValue = Ssw_ManSweepLatch( p );
            if ( p->pPars->fVerbose )
            {
                Abc_Print( 1, "%3d : C =%7d. Cl =%7d. Pr =%6d. Cex =%5d. R =%4d. F =%4d. ",
                    nIter, Ssw_ClassesCand1Num(p->ppClasses), Ssw_ClassesClassNum(p->ppClasses),
                    p->nSatProof-nSatProof, p->nSatCallsSat-nSatCallsSat,
                    p->nRecycles-nRecycles, p->nSatFailsReal-nSatFailsReal );
                ABC_PRT( "T", Abc_Clock() - clk );
            }
        }
        else
        {
            if ( p->pPars->fConstrs )
                RetValue = Ssw_ManSweepConstr( p );
            else if ( p->pPars->fDynamic )
                RetValue = Ssw_ManSweepDyn( p );
            else
                RetValue = Ssw_ManSweep( p );

            p->pPars->nConflicts += p->pMSat->pSat->stats.conflicts;
            if ( p->pPars->fVerbose )
            {
                Abc_Print( 1, "%3d : C =%7d. Cl =%7d. LR =%6d. NR =%6d. ",
                    nIter, Ssw_ClassesCand1Num(p->ppClasses), Ssw_ClassesClassNum(p->ppClasses),
                    p->nConstrReduced, Aig_ManNodeNum(p->pFrames) );
                if ( p->pPars->fDynamic )
                {
                    Abc_Print( 1, "Cex =%5d. ", p->nSatCallsSat-nSatCallsSat );
                    Abc_Print( 1, "R =%4d. ",   p->nRecycles-nRecycles );
                }
                Abc_Print( 1, "F =%5d. %s ", p->nSatFailsReal-nSatFailsReal,
                    (Saig_ManPoNum(p->pAig)==1 && Ssw_ObjIsConst1Cand(p->pAig,Aig_ObjFanin0(Aig_ManCo(p->pAig,0))))? "+" : "-" );
                ABC_PRT( "T", Abc_Clock() - clk );
            }
//            if ( p->pPars->fDynamic && p->nSatCallsSat-nSatCallsSat < 100 )
//                p->pPars->nBTLimit = 10000;

            if ( p->pPars->fStopWhenGone && Saig_ManPoNum(p->pAig) == 1 && !Ssw_ObjIsConst1Cand(p->pAig,Aig_ObjFanin0(Aig_ManCo(p->pAig,0))) )
            {
                printf( "Iterative refinement is stopped after iteration %d\n", nIter );
                printf( "because the property output is no longer a candidate constant.\n" );
                // prepare to quite
                p->nLitsEnd  = p->nLitsBeg;
                p->nNodesEnd = p->nNodesBeg;
                p->nRegsEnd  = p->nRegsBeg;
                // cleanup
                Ssw_SatStop( p->pMSat );
                p->pMSat = NULL;
                Ssw_ManCleanup( p );
                // cleanup
                Aig_ManSetPhase( p->pAig );
                Aig_ManCleanMarkB( p->pAig );
                return Aig_ManDupSimple( p->pAig );
            }
        }
        nSatProof     = p->nSatProof;
        nSatCallsSat  = p->nSatCallsSat;
        nRecycles     = p->nRecycles;
        nSatFailsReal = p->nSatFailsReal;
        nUniques      = p->nUniques;

        p->nVarsMax  = Abc_MaxInt( p->nVarsMax,  p->pMSat->nSatVars );
        p->nCallsMax = Abc_MaxInt( p->nCallsMax, p->pMSat->nSolverCalls );
        Ssw_SatStop( p->pMSat );
        p->pMSat = NULL;
        Ssw_ManCleanup( p );
        if ( !RetValue )
            break;
        if ( p->pPars->pFunc )
            ((int (*)(void *))p->pPars->pFunc)( p->pPars->pData );
    }

finalize:
    p->pPars->nIters = nIter + 1;
p->timeTotal = Abc_Clock() - clkTotal;

    Ssw_ManUpdateEquivs( p, p->pAig, p->pPars->fVerbose );
    pAigNew = Aig_ManDupRepr( p->pAig, 0 );
    Aig_ManSeqCleanup( pAigNew );
//Ssw_ClassesPrint( p->ppClasses, 1 );
    // get the final stats
    p->nLitsEnd  = Ssw_ClassesLitNum( p->ppClasses );
    p->nNodesEnd = Aig_ManNodeNum(pAigNew);
    p->nRegsEnd  = Aig_ManRegNum(pAigNew);
    // cleanup
    Aig_ManSetPhase( p->pAig );
    Aig_ManCleanMarkB( p->pAig );
    return pAigNew;
}